

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O3

btree_result btree_insert(btree *btree,void *key,void *value)

{
  _func_voidref_void_ptr_bid_t_ptr **pp_Var1;
  byte bVar2;
  char cVar3;
  char cVar4;
  ushort uVar5;
  code *pcVar6;
  _func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *p_Var7;
  undefined8 uVar8;
  _func_int_void_ptr_bid_t *p_Var9;
  code *pcVar10;
  _func_voidref_void_ptr_bid_t_ptr *p_Var11;
  _func_void_void_ptr_bid_t *p_Var12;
  btree_kv_ops *pbVar13;
  list_elem *plVar14;
  list_elem *plVar15;
  bool bVar16;
  bid_t bVar17;
  idx_t *idx;
  bnode **ppbVar18;
  btree_blk_ops *pbVar19;
  undefined1 *puVar20;
  idx_t iVar21;
  int iVar22;
  undefined8 *puVar23;
  bnode *pbVar24;
  ulong uVar25;
  btree_blk_ops *pbVar26;
  bnode *pbVar27;
  _func_voidref_void_ptr_bid_t *p_Var28;
  long lVar29;
  ulong uVar30;
  list_elem *plVar31;
  bnode **ppbVar32;
  void *pvVar33;
  btree_blk_ops *pbVar34;
  list_elem *plVar35;
  uint uVar36;
  void *pvVar37;
  long lVar38;
  btree_blk_ops *pbVar39;
  bnode *node;
  void *__s;
  list *plVar40;
  ulong __n;
  void *__s_00;
  bnode *apbStack_120 [9];
  ulong local_d0;
  bid_t _bid;
  bid_t new_bid;
  size_t nodesize;
  idx_t *local_b0;
  void *local_a8;
  bnode **local_a0;
  char local_98;
  uint local_94;
  void *local_90;
  btree_blk_ops *local_88;
  btree_blk_ops *local_80;
  btree_blk_ops *local_78;
  list *local_70;
  void *local_68;
  bnode **local_60;
  btree_blk_ops *local_58;
  undefined1 *local_50;
  btree_blk_ops *local_48;
  char local_39;
  btree_blk_ops *local_38;
  
  local_50 = &stack0xffffffffffffff28 + -(ulong)(btree->ksize + 0xf & 0xfffffff0);
  local_88 = (btree_blk_ops *)(local_50 + -(ulong)(btree->vsize + 0xf & 0xfffffff0));
  uVar5 = btree->height;
  __n = (ulong)uVar5;
  local_b0 = (idx_t *)((long)local_88 - (ulong)((uint)uVar5 * 2 + 0xf & 0xfffffff0));
  uVar25 = (ulong)((uint)uVar5 * 8 + 0xf & 0xfffffff0);
  local_48 = (btree_blk_ops *)((long)local_b0 - uVar25);
  uVar30 = (ulong)(uVar5 + 0xf & 0xfffffff0);
  __s = (void *)((long)local_48 - uVar30);
  __s_00 = (void *)((long)__s - uVar30);
  pvVar33 = (void *)((long)__s_00 - uVar30);
  pvVar37 = (void *)((long)pvVar33 - uVar30);
  local_70 = (list *)((long)pvVar37 + (ulong)uVar5 * -0x10);
  ppbVar32 = (bnode **)((long)local_70 - uVar25);
  local_80 = (btree_blk_ops *)value;
  local_78 = (btree_blk_ops *)key;
  local_60 = ppbVar32;
  local_38 = (btree_blk_ops *)btree;
  if (uVar5 != 0) {
    ppbVar32[-1] = (bnode *)0x10e6b3;
    memset(pvVar37,0,__n);
    ppbVar32[-1] = (bnode *)0x10e6c0;
    memset(pvVar33,0,__n);
    ppbVar32[-1] = (bnode *)0x10e6cd;
    memset(__s,0,__n);
    ppbVar32[-1] = (bnode *)0x10e6da;
    memset(__s_00,0,__n);
  }
  pbVar39 = local_38;
  puVar20 = local_50;
  pbVar34 = local_88;
  pcVar6 = *(code **)(local_38->blk_move + 0x30);
  nodesize = (size_t)pvVar33;
  local_a8 = pvVar37;
  local_90 = __s;
  local_68 = __s_00;
  if (pcVar6 != (code *)0x0) {
    ppbVar32[-1] = (bnode *)0x10e711;
    (*pcVar6)(pbVar39,puVar20,pbVar34);
    plVar40 = local_70;
    uVar5 = *(ushort *)((long)&pbVar39->blk_alloc + 2);
    if (uVar5 != 0) {
      ppbVar32[-1] = (bnode *)0x10e728;
      memset(plVar40,0,(ulong)uVar5 << 4);
    }
  }
  ppbVar32[-1] = (bnode *)0x10e732;
  puVar23 = (undefined8 *)malloc(0x20);
  bVar2 = *(byte *)&pbVar39->blk_alloc;
  ppbVar32[-1] = (bnode *)0x10e73d;
  pvVar33 = malloc((ulong)bVar2);
  *puVar23 = pvVar33;
  bVar2 = *(byte *)((long)&pbVar39->blk_alloc + 1);
  ppbVar32[-1] = (bnode *)0x10e74c;
  pvVar37 = malloc((ulong)bVar2);
  puVar23[1] = pvVar37;
  pcVar6 = *(code **)(pbVar39->blk_move + 0x30);
  if (pcVar6 != (code *)0x0) {
    ppbVar32[-1] = (bnode *)0x10e76b;
    (*pcVar6)(pbVar39,pvVar33,pvVar37);
  }
  pbVar34 = local_38;
  if (local_78 != (btree_blk_ops *)0x0) {
    pcVar6 = *(code **)(local_38->blk_move + 0x40);
    ppbVar32[-1] = (bnode *)0x10e782;
    (*pcVar6)(pbVar34,pvVar33);
  }
  pbVar34 = local_38;
  if (local_80 != (btree_blk_ops *)0x0) {
    pcVar6 = *(code **)(local_38->blk_move + 0x48);
    ppbVar32[-1] = (bnode *)0x10e79c;
    (*pcVar6)(pbVar34,pvVar37);
  }
  plVar40 = local_70;
  ppbVar32[-1] = (bnode *)0x10e7ac;
  list_push_back(plVar40,(list_elem *)(puVar23 + 2));
  *(undefined1 *)nodesize = 1;
  uVar5 = *(ushort *)((long)&pbVar34->blk_alloc + 2);
  uVar25 = (ulong)uVar5;
  *(_func_voidref_void_ptr_bid_t_ptr **)((long)local_48 + uVar25 * 8 + -8) = pbVar34->blk_alloc_sub;
  pbVar39 = pbVar34;
  if (uVar5 != 0) {
    uVar30 = (ulong)((uint)uVar5 + (uint)uVar5);
    local_58 = (btree_blk_ops *)((long)local_b0 + (uVar30 - 2));
    local_a0 = local_60 + (uVar25 - 1);
    local_80 = (btree_blk_ops *)((long)local_48 + uVar25 * 8 + -8);
    lVar38 = 0;
    do {
      p_Var7 = pbVar34->blk_enlarge_node;
      uVar8 = *(undefined8 *)((long)&local_80->blk_alloc + lVar38 * 4);
      pcVar6 = *(code **)(pbVar34->blk_read + 0x18);
      ppbVar32[-1] = (bnode *)0x10e81a;
      pbVar24 = (bnode *)(*pcVar6)(p_Var7,uVar8);
      pbVar39 = local_38;
      pbVar34 = local_78;
      pbVar27 = pbVar24 + 1;
      if ((pbVar24->flag & 2) != 0) {
        pbVar27 = (bnode *)((long)&pbVar27->kvsize +
                           (ulong)((ushort)(pbVar27->kvsize << 8 | pbVar27->kvsize >> 8) + 0x11 &
                                  0xfffffff0));
      }
      (pbVar24->field_4).data = pbVar27;
      *(bnode **)((long)local_a0 + lVar38 * 4) = pbVar24;
      ppbVar32[-1] = (bnode *)0x10e865;
      iVar21 = _btree_find_entry((btree *)pbVar39,pbVar24,pbVar34);
      pbVar34 = local_38;
      puVar20 = local_50;
      pbVar19 = local_88;
      *(idx_t *)((long)&local_58->blk_alloc + lVar38) = iVar21;
      pbVar26 = local_58;
      if (uVar30 + lVar38 == 2) break;
      if (iVar21 == 0xffff) {
        *(undefined2 *)((long)&local_58->blk_alloc + lVar38) = 0;
        iVar21 = 0;
      }
      pcVar6 = *(code **)local_38->blk_move;
      ppbVar32[-1] = (bnode *)0x10e8a2;
      (*pcVar6)(pbVar24,iVar21,puVar20,pbVar19);
      pcVar6 = *(code **)(pbVar34->blk_move + 0x68);
      ppbVar32[-1] = (bnode *)0x10e8ac;
      uVar25 = (*pcVar6)(pbVar19);
      *(ulong *)((long)local_80 + lVar38 * 4 + -8) =
           uVar25 >> 0x38 | (uVar25 & 0xff000000000000) >> 0x28 | (uVar25 & 0xff0000000000) >> 0x18
           | (uVar25 & 0xff00000000) >> 8 | (uVar25 & 0xff000000) << 8 | (uVar25 & 0xff0000) << 0x18
           | (uVar25 & 0xff00) << 0x28 | uVar25 << 0x38;
      lVar38 = lVar38 + -2;
      pbVar26 = local_80;
      pbVar39 = pbVar34;
    } while (uVar30 + lVar38 != 0);
    if (*(short *)((long)&pbVar39->blk_alloc + 2) != 0) {
      local_58 = (btree_blk_ops *)0x0;
      uVar25 = 0;
      local_94 = 0;
      pvVar33 = local_68;
      pbVar34 = local_78;
      do {
        puVar20 = local_50;
        uVar5 = local_b0[uVar25];
        local_a0 = (bnode **)CONCAT44(local_a0._4_4_,(uint)uVar5);
        if (uVar5 == 0xffff) {
          if (uVar25 != 0) goto LAB_0010e95a;
LAB_0010e9b9:
          bVar16 = false;
        }
        else {
          pbVar24 = local_60[uVar25];
          pbVar26 = (btree_blk_ops *)0x0;
          pcVar6 = *(code **)pbVar39->blk_move;
          ppbVar32[-1] = (bnode *)0x10e922;
          (*pcVar6)(pbVar24,uVar5,puVar20,0);
          puVar20 = local_50;
          if (uVar25 == 0) goto LAB_0010e9b9;
          if (uVar5 == 0) {
            p_Var9 = pbVar39->blk_is_writable;
            pcVar6 = *(code **)(pbVar39->blk_move + 0x60);
            ppbVar32[-1] = (bnode *)0x10e943;
            iVar22 = (*pcVar6)(pbVar34,puVar20,p_Var9);
            if (iVar22 < 0) {
              *(undefined1 *)((long)local_a8 + uVar25) = 1;
            }
          }
LAB_0010e95a:
          bVar16 = true;
          if (*(char *)((uVar25 - 1) + (long)pvVar33) != '\0') {
            uVar30 = *(ulong *)((long)local_48 + uVar25 * 8 + -8);
            local_d0 = uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                       (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                       (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                       (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38;
            pcVar6 = *(code **)(pbVar39->blk_move + 8);
            pbVar24 = local_60[uVar25];
            pcVar10 = *(code **)(pbVar39->blk_move + 0x70);
            ppbVar32[-1] = (bnode *)0x10e992;
            pbVar26 = (btree_blk_ops *)(*pcVar10)(&stack0xffffffffffffff30);
            puVar20 = local_50;
            uVar30 = (ulong)local_a0 & 0xffffffff;
            ppbVar32[-1] = (bnode *)0x10e9a4;
            (*pcVar6)(pbVar24,uVar30,puVar20,pbVar26);
            bVar16 = true;
            *(undefined1 *)((long)local_90 + uVar25) = 1;
            pvVar33 = local_68;
          }
        }
        pbVar39 = local_48;
        puVar20 = local_50;
        cVar3 = *(char *)(nodesize + uVar25);
        cVar4 = *(char *)((long)local_a8 + uVar25);
        pbVar26 = (btree_blk_ops *)CONCAT71((int7)((ulong)pbVar26 >> 8),cVar4 == '\0');
        if (cVar3 == '\0') {
          if (cVar4 != '\0') {
            _local_98 = 0;
            goto LAB_0010ea0c;
          }
        }
        else {
          _local_98 = SUB84(pbVar26,0);
          if (cVar4 == '\0') {
            pbVar34 = (btree_blk_ops *)0x0;
          }
LAB_0010ea0c:
          uVar36 = 0;
          local_39 = cVar3;
          if (uVar5 != 0xffff && !bVar16) {
            plVar35 = local_70[uVar25].head[-1].prev;
            p_Var9 = local_38->blk_is_writable;
            pcVar6 = *(code **)(local_38->blk_move + 0x60);
            ppbVar32[-1] = (bnode *)0x10ea4c;
            iVar22 = (*pcVar6)(plVar35,puVar20,p_Var9);
            uVar36 = (uint)(iVar22 == 0);
          }
          pbVar19 = local_38;
          plVar40 = local_70 + uVar25;
          pbVar24 = local_60[uVar25];
          p_Var11 = (&pbVar39->blk_alloc)[uVar25];
          ppbVar32[-1] = (bnode *)0x10ea88;
          pbVar26 = pbVar34;
          iVar22 = _bnode_size_check((btree *)pbVar19,(bid_t)p_Var11,pbVar24,pbVar34,plVar40,
                                     &new_bid);
          pbVar39 = local_38;
          local_94 = uVar36;
          if (iVar22 == 0 && uVar36 == 0) {
            local_80 = (btree_blk_ops *)(uVar25 + 1);
            pbVar27 = pbVar24;
            do {
              pbVar26 = local_48;
              bVar17 = new_bid;
              p_Var28 = pbVar39->blk_read;
              pcVar6 = *(code **)(p_Var28 + 0x10);
              if ((pcVar6 == (code *)0x0) ||
                 (p_Var11 = (&local_48->blk_alloc)[uVar25], (char)((ulong)p_Var11 >> 0x30) == '\0'))
              {
                local_60[uVar25] = pbVar27;
LAB_0010ec10:
                pvVar33 = local_68;
                bVar17 = new_bid;
                p_Var7 = local_38->blk_enlarge_node;
                pcVar6 = *(code **)(p_Var28 + 0x38);
                ppbVar32[-1] = (bnode *)0x10ec2d;
                lVar38 = (*pcVar6)(p_Var7,0xffffffffffffffff);
                pbVar39 = local_38;
                pbVar26 = local_48;
                ppbVar18 = local_60;
                pbVar34 = local_78;
                pvVar37 = local_a8;
                idx = local_b0;
                lVar29 = -0x11;
                if ((pbVar27->flag & 2) != 0) {
                  lVar29 = -0x11 - (ulong)((ushort)(pbVar27[1].kvsize << 8 | pbVar27[1].kvsize >> 8)
                                           + 0x11 & 0xfffffff0);
                }
                uVar30 = (bVar17 + lVar29 + lVar38 + lVar29) / (ulong)(lVar38 + lVar29);
                if (uVar30 == 1) {
                  uVar30 = 2;
                }
                ppbVar32[-2] = (bnode *)nodesize;
                ppbVar32[-3] = (bnode *)pvVar37;
                ppbVar32[-4] = (bnode *)local_90;
                ppbVar32[-5] = (bnode *)local_88;
                ppbVar32[-6] = (bnode *)local_50;
                ppbVar32[-7] = (bnode *)uVar30;
                ppbVar32[-8] = (bnode *)local_70;
                ppbVar32[-9] = (bnode *)0x10ecc3;
                iVar22 = _btree_split_node((btree *)pbVar39,pbVar34,ppbVar18,(bid_t *)pbVar26,idx,
                                           (int)uVar25,(list *)ppbVar32[-8],(size_t)ppbVar32[-7],
                                           ppbVar32[-6],ppbVar32[-5],(int8_t *)ppbVar32[-4],
                                           (int8_t *)ppbVar32[-3],(int8_t *)ppbVar32[-2]);
                if (iVar22 == 0) goto LAB_0010ecd6;
                local_58 = (btree_blk_ops *)0xffffffffffffffff;
                goto LAB_0010ed50;
              }
              p_Var7 = local_38->blk_enlarge_node;
              ppbVar32[-1] = (bnode *)0x10eb72;
              pbVar24 = (bnode *)(*pcVar6)(p_Var7,p_Var11,bVar17,&_bid);
              pbVar39 = local_38;
              if (pbVar24 == (bnode *)0x0) {
                local_60[uVar25] = pbVar27;
                p_Var28 = local_38->blk_read;
                goto LAB_0010ec10;
              }
              *(undefined1 *)((long)local_68 + uVar25) = 1;
              (&pbVar26->blk_alloc)[uVar25] = (_func_voidref_void_ptr_bid_t_ptr *)_bid;
              pbVar27 = pbVar24 + 1;
              if ((pbVar24->flag & 2) != 0) {
                pbVar27 = (bnode *)((long)&pbVar27->kvsize +
                                   (ulong)((ushort)(pbVar27->kvsize << 8 | pbVar27->kvsize >> 8) +
                                           0x11 & 0xfffffff0));
              }
              (pbVar24->field_4).data = pbVar27;
              p_Var11 = (&local_48->blk_alloc)[uVar25];
              if (local_80 == (btree_blk_ops *)(ulong)*(ushort *)((long)&local_38->blk_alloc + 2)) {
                local_38->blk_alloc_sub = p_Var11;
              }
              ppbVar32[-1] = (bnode *)0x10ebe9;
              pbVar26 = pbVar34;
              iVar22 = _bnode_size_check((btree *)pbVar39,(bid_t)p_Var11,pbVar24,pbVar34,plVar40,
                                         &new_bid);
              pbVar27 = pbVar24;
            } while (iVar22 == 0);
          }
          local_60[uVar25] = pbVar24;
          if (local_39 != '\0') {
            for (plVar35 = plVar40->head; plVar35 != (list_elem *)0x0; plVar35 = plVar35->next) {
              plVar31 = plVar35[-1].prev;
              pbVar26 = (btree_blk_ops *)plVar35[-1].next;
              ppbVar32[-1] = (bnode *)0x10eac6;
              _btree_add_entry((btree *)pbVar39,pbVar24,plVar31,pbVar26);
            }
          }
          pbVar39 = local_38;
          puVar20 = local_50;
          pbVar34 = local_88;
          ppbVar18 = local_a0;
          if (local_98 == '\0') {
            uVar30 = (ulong)local_a0 & 0xffffffff;
            pcVar6 = *(code **)local_38->blk_move;
            ppbVar32[-1] = (bnode *)0x10eaf7;
            (*pcVar6)(pbVar24,uVar30,puVar20,pbVar34);
            pbVar26 = local_78;
            pcVar6 = *(code **)(pbVar39->blk_move + 8);
            ppbVar32[-1] = (bnode *)0x10eb0b;
            (*pcVar6)(pbVar24,(ulong)ppbVar18 & 0xffffffff,pbVar26,pbVar34);
            pbVar26 = pbVar34;
          }
          *(undefined1 *)((long)local_90 + uVar25) = 1;
          pvVar33 = local_68;
          pbVar34 = local_78;
        }
LAB_0010ecd6:
        pbVar19 = local_38;
        pbVar39 = local_48;
        if (*(char *)((long)local_90 + uVar25) != '\0') {
          p_Var7 = local_38->blk_enlarge_node;
          p_Var11 = (&local_48->blk_alloc)[uVar25];
          p_Var9 = ((btree_blk_ops *)local_38->blk_read)->blk_is_writable;
          ppbVar32[-1] = (bnode *)0x10ecf4;
          iVar22 = (*p_Var9)(p_Var7,(bid_t)p_Var11);
          p_Var7 = pbVar19->blk_enlarge_node;
          pbVar26 = (btree_blk_ops *)pbVar19->blk_read;
          p_Var11 = (&pbVar39->blk_alloc)[uVar25];
          if (iVar22 == 0) {
            pp_Var1 = &pbVar39->blk_alloc + uVar25;
            pbVar13 = (btree_kv_ops *)pbVar26->blk_move;
            ppbVar32[-1] = (bnode *)0x10ed17;
            (*(code *)pbVar13)(p_Var7,p_Var11,pp_Var1);
            *(undefined1 *)((long)local_68 + uVar25) = 1;
            pbVar26 = (btree_blk_ops *)(ulong)*(ushort *)((long)&pbVar19->blk_alloc + 2);
            pvVar33 = local_68;
            if ((btree_blk_ops *)(uVar25 + 1) == pbVar26) {
              local_38->blk_alloc_sub = *pp_Var1;
              pbVar26 = local_38;
            }
          }
          else {
            p_Var12 = pbVar26->blk_set_dirty;
            ppbVar32[-1] = (bnode *)0x10ed07;
            (*p_Var12)(p_Var7,(bid_t)p_Var11);
            pvVar33 = local_68;
          }
        }
        uVar25 = uVar25 + 1;
        pbVar39 = local_38;
      } while (uVar25 < *(ushort *)((long)&local_38->blk_alloc + 2));
LAB_0010ed50:
      local_48 = (btree_blk_ops *)CONCAT44(local_48._4_4_,(uint)(local_94 != 0));
      goto LAB_0010ed70;
    }
  }
  local_58 = (btree_blk_ops *)0x0;
  local_48 = (btree_blk_ops *)((ulong)local_48 & 0xffffffff00000000);
LAB_0010ed70:
  pcVar6 = *(code **)(pbVar39->blk_read + 0x48);
  if (pcVar6 != (code *)0x0) {
    p_Var7 = pbVar39->blk_enlarge_node;
    ppbVar32[-1] = (bnode *)0x10ed83;
    (*pcVar6)(p_Var7);
  }
  puVar20 = local_50;
  pbVar34 = local_88;
  pcVar6 = *(code **)(pbVar39->blk_move + 0x38);
  if (pcVar6 != (code *)0x0) {
    ppbVar32[-1] = (bnode *)0x10ed9d;
    (*pcVar6)((btree *)pbVar39,puVar20,pbVar34);
  }
  uVar25 = (ulong)*(ushort *)((long)&pbVar39->blk_alloc + 2);
  lVar38 = uVar25 + (long)local_58;
  if (lVar38 != 0 && SCARRY8(uVar25,(long)local_58) == lVar38 < 0) {
    lVar38 = 0;
    do {
      if (local_70[lVar38].head != (list_elem *)0x0) {
        plVar40 = local_70 + lVar38;
        plVar35 = local_70[lVar38].head;
        do {
          ppbVar32[-1] = (bnode *)0x10edd1;
          plVar31 = list_remove(plVar40,plVar35);
          pcVar6 = *(code **)(pbVar39->blk_move + 0x38);
          if (pcVar6 != (code *)0x0) {
            plVar14 = plVar35[-1].prev;
            plVar15 = plVar35[-1].next;
            ppbVar32[-1] = (bnode *)0x10edf0;
            (*pcVar6)((btree *)pbVar39,plVar14,plVar15);
          }
          plVar14 = plVar35[-1].prev;
          ppbVar32[-1] = (bnode *)0x10edff;
          free(plVar14);
          plVar14 = plVar35[-1].next;
          ppbVar32[-1] = (bnode *)0x10ee09;
          free(plVar14);
          pbVar39 = local_38;
          ppbVar32[-1] = (bnode *)0x10ee15;
          free(plVar35 + -1);
          plVar35 = plVar31;
        } while (plVar31 != (list_elem *)0x0);
      }
      lVar38 = lVar38 + 1;
    } while (lVar38 < (long)((ulong)*(uint16_t *)((long)&pbVar39->blk_alloc + 2) + (long)local_58));
  }
  return (btree_result)local_48;
}

Assistant:

btree_result btree_insert(struct btree *btree, void *key, void *value)
{
    void *addr;
    size_t nsplitnode = 1;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v = alca(uint8_t, btree->vsize);
    // index# and block ID for each level
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid = alca(bid_t, btree->height);
    bid_t _bid;
    // flags
    int8_t *modified = alca(int8_t, btree->height);
    int8_t *moved = alca(int8_t, btree->height);
    int8_t *ins = alca(int8_t, btree->height);
    int8_t *minkey_replace = alca(int8_t, btree->height);
    int8_t height_growup;

    // key, value to be inserted
    struct list *kv_ins_list = alca(struct list, btree->height);
    struct kv_ins_item *kv_item;
    struct list_elem *e;

    // index# where kv is inserted
    idx_t *idx_ins = alca(idx_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i, j, _is_update = 0;

    // initialize flags
    for (i=0;i<btree->height;++i) {
        moved[i] = modified[i] = ins[i] = minkey_replace[i] = 0;
    }
    height_growup = 0;

    // initialize temporary variables
    if (btree->kv_ops->init_kv_var) {
        btree->kv_ops->init_kv_var(btree, k, v);
        for (i=0;i<btree->height;++i){
            list_init(&kv_ins_list[i]);
        }
    }

    // copy key-value pair to be inserted into leaf node
    kv_item = _kv_ins_item_create(btree, key, value);
    list_push_back(&kv_ins_list[0], &kv_item->le);

    ins[0] = 1;

    // set root node
    bid[btree->height-1] = btree->root_bid;

    // find path from root to leaf
    for (i=btree->height-1; i>=0; --i){
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (i > 0) {
            // index (non-leaf) node
            if (idx[i] == BTREE_IDX_NOT_FOUND)
                // KEY is smaller than the smallest key in this node ..
                // just follow the smallest key
                idx[i] = 0;

            // get bid of child node from value
            btree->kv_ops->get_kv(node[i], idx[i], k, v);
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node .. do nothing
        }
    }

    // cascaded insert from leaf to root
    for (i=0;i<btree->height;++i){

        if (idx[i] != BTREE_IDX_NOT_FOUND)
            btree->kv_ops->get_kv(node[i], idx[i], k, NULL);

        if (i > 0) {
            // in case of index node
            // when KEY is smaller than smallest key in index node
            if (idx[i] == 0 && btree->kv_ops->cmp(key, k, btree->aux) < 0) {
                // change node's smallest key
                minkey_replace[i] = 1;
            }

            // when child node is moved to new block
            if (moved[i-1]) {
                // replace the bid (value)
                _bid = _endian_encode(bid[i-1]);
                btree->kv_ops->set_kv(node[i], idx[i], k,
                                      btree->kv_ops->bid2value(&_bid));
                modified[i] = 1;
            }
        }

        if (ins[i] || minkey_replace[i]) {
            // there is a key-value pair to be inserted into this (level of)
            // node check whether btree node space is enough to add new
            // key-value pair or not, OR action is not insertion but update
            // (key_ins exists in current node)
            _is_update = 0;
            size_t nodesize;
            void *new_minkey = (minkey_replace[i])?(key):(NULL);

            if (i==0) {
                e = list_begin(&kv_ins_list[i]);
                kv_item = _get_entry(e, struct kv_ins_item, le);
                _is_update =
                    (idx[i] != BTREE_IDX_NOT_FOUND &&
                     !btree->kv_ops->cmp(kv_item->key, k, btree->aux));
            }

        check_node:;
            int _size_check =
                _bnode_size_check(btree, bid[i], node[i], new_minkey,
                                  &kv_ins_list[i], &nodesize);

            if (_size_check || _is_update ) {
                //2 enough space
                if (ins[i]) {
                    // insert key/value pair(s)
                    // insert all kv pairs on list
                    e = list_begin(&kv_ins_list[i]);
                    while(e) {
                        kv_item = _get_entry(e, struct kv_ins_item, le);
                        idx_ins[i] = _btree_add_entry(btree, node[i],
                                                 kv_item->key, kv_item->value);
                        e = list_next(e);
                    }
                }
                if (minkey_replace[i]) {
                    // replace the minimum key in the node to KEY
                    btree->kv_ops->get_kv(node[i], idx[i], k, v);
                    btree->kv_ops->set_kv(node[i], idx[i], key, v);
                }
                modified[i] = 1;

            }else{
                //2 not enough
                // first check if the node can be enlarged
                if (btree->blk_ops->blk_enlarge_node &&
                    is_subblock(bid[i])) {
                    bid_t new_bid;
                    addr = btree->blk_ops->blk_enlarge_node(btree->blk_handle,
                        bid[i], nodesize, &new_bid);
                    if (addr) {
                        // the node can be enlarged .. fetch the enlarged node
                        moved[i] = 1;
                        bid[i] = new_bid;
                        node[i] = _fetch_bnode(btree, addr, i+1);
                        if (i+1 == btree->height) {
                            // if moved node is root node
                            btree->root_bid = bid[i];
                        }
                        // start over
                        goto check_node;
                    }
                }

                //otherwise, split the node
                nsplitnode = _btree_get_nsplitnode(btree, BLK_NOT_FOUND,
                                                   node[i], nodesize);
                // force the node split when the node size of new layout is
                // larger than the current node size
                if (nsplitnode == 1) nsplitnode = 2;

                height_growup = _btree_split_node(
                    btree, key, node, bid, idx, i,
                    kv_ins_list, nsplitnode, k, v,
                    modified, minkey_replace, ins);
            } // split
        } // insert

        if (height_growup) break;

        if (modified[i]) {
            //2 when the node is modified
            if (!btree->blk_ops->blk_is_writable(btree->blk_handle, bid[i])) {
                // not writable .. already flushed block -> cannot overwrite,
                // we have to move to new block
                height_growup = _btree_move_modified_node(
                    btree, key, node, bid, idx, i,
                    kv_ins_list, k, v,
                    modified, minkey_replace, ins, moved);

                if (height_growup) break;
            }else{
                // writable .. just set dirty to write back into storage
                btree->blk_ops->blk_set_dirty(btree->blk_handle, bid[i]);
            } // is writable
        } // is modified
    } // for loop

    // release temporary resources
    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);

    for (j=0; j < ((height_growup)?(btree->height-1):(btree->height)); ++j){
        e = list_begin(&kv_ins_list[j]);
        while(e) {
            kv_item = _get_entry(e, struct kv_ins_item, le);
            e = list_remove(&kv_ins_list[j], e);

            if (btree->kv_ops->free_kv_var) {
                btree->kv_ops->free_kv_var(btree, kv_item->key, kv_item->value);
            }
            _kv_ins_item_free(kv_item);
        }
    }

    if (_is_update) {
        return BTREE_RESULT_UPDATE;
    }else{
        return BTREE_RESULT_SUCCESS;
    }
}